

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSep.h
# Opt level: O0

StreamSep * __thiscall
Hpipe::StreamSepMaker::operator<<
          (StreamSep *__return_storage_ptr__,StreamSepMaker *this,char (*val) [29])

{
  long lVar1;
  char (*val_local) [29];
  StreamSepMaker *this_local;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::operator<<(this->stream,(string *)&this->beg);
  }
  else {
    std::operator<<(this->stream,(string *)&this->first_beg);
    std::__cxx11::string::clear();
  }
  std::operator<<(this->stream,*val);
  StreamSep::StreamSep(__return_storage_ptr__,this->stream,&this->sep,&this->end);
  return __return_storage_ptr__;
}

Assistant:

StreamSep operator<<( const T &val ) {
        if( first_beg.size() ) {
            *stream << first_beg;
            first_beg.clear();
        } else
            *stream << beg;
        *stream << val;
        return StreamSep( stream, sep, end );
    }